

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O3

bool rcg::convertImage(uint8_t *rgb_out,uint8_t *mono_out,uint8_t *raw,uint64_t pixelformat,
                      size_t width,size_t height,size_t xpadding)

{
  long lVar1;
  byte bVar2;
  uint8_t uVar3;
  size_t __n;
  uint uVar4;
  size_t i;
  byte *pbVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  size_t i_1;
  size_t sVar12;
  uint8_t *p;
  int iVar13;
  byte *pbVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  uint8_t rgb [12];
  byte *local_88;
  byte *local_78;
  byte *local_68;
  uint8_t local_4c [12];
  long local_40;
  ulong local_38;
  
  if ((long)pixelformat < 0x20c005a) {
    if (pixelformat - 0x1080008 < 4) {
      pbVar5 = (byte *)operator_new__(width * 3 + 6);
      lVar18 = width * 2 + 2;
      memcpy(pbVar5 + width + 3,raw + xpadding + width,width);
      lVar1 = width * 2;
      memcpy(pbVar5 + lVar1 + 5,raw,width);
      pbVar5[width + 2] = pbVar5[width + 4];
      pbVar5[lVar1 + 3] = pbVar5[lVar1 + 1];
      pbVar5[lVar1 + 4] = pbVar5[lVar1 + 6];
      pbVar5[width + 3 + lVar18] = pbVar5[width + 1 + lVar18];
      if (height != 0) {
        local_40 = width * 3;
        local_88 = pbVar5 + width + 2;
        local_78 = pbVar5 + width * 2 + 4;
        bVar20 = (pixelformat & 0xfffffffffffffffe) == 0x1080008;
        bVar21 = (pixelformat & 0xfffffffffffffffd) == 0x1080008;
        local_38 = 0;
        local_68 = pbVar5;
        do {
          pbVar10 = local_68;
          local_38 = local_38 + 1;
          if (local_38 < height) {
            memcpy(local_68 + 1,raw + local_38 * (xpadding + width),width);
            *local_68 = local_68[2];
            local_68[width + 1] = local_68[width - 1];
            local_68 = local_88;
            local_88 = local_78;
            local_78 = pbVar10;
          }
          puVar6 = mono_out;
          if (bVar20) {
            if (bVar21) {
              uVar4 = (uint)*local_88 + (uint)local_88[2] + 1 >> 1;
              bVar2 = local_88[1];
              uVar19 = (uint)local_68[1] + (uint)local_78[1] + 1 >> 1;
              if (rgb_out == (byte *)0x0) {
                pbVar10 = (byte *)0x0;
              }
              else {
                *rgb_out = (byte)uVar4;
                rgb_out[1] = bVar2;
                pbVar10 = rgb_out + 3;
                rgb_out[2] = (byte)uVar19;
              }
              uVar17 = 1;
              pbVar11 = local_78 + 1;
              pbVar14 = local_68 + 1;
              pbVar16 = local_88 + 1;
              if (mono_out == (uint8_t *)0x0) {
                puVar6 = (uint8_t *)0x0;
              }
              else {
                *mono_out = (uint8_t)((uint)bVar2 * 0x4b22 + (uVar4 & 0xff) * 0x2646 +
                                      (uVar19 & 0xff) * 0xe98 + 0x4000 >> 0xf);
                puVar6 = mono_out + 1;
              }
            }
            else {
              uVar17 = 0;
              pbVar10 = rgb_out;
              pbVar11 = local_78;
              pbVar14 = local_68;
              pbVar16 = local_88;
            }
            if (uVar17 + 1 < width) {
              lVar18 = 0;
              do {
                bVar2 = pbVar16[lVar18 + 1];
                uVar19 = (uint)pbVar16[lVar18] +
                         (uint)pbVar11[lVar18 + 1] + (uint)pbVar14[lVar18 + 1] +
                         (uint)pbVar16[lVar18 + 2] + 2 >> 2;
                uVar4 = (uint)pbVar11[lVar18] + (uint)pbVar14[lVar18 + 2] + (uint)pbVar14[lVar18] +
                        (uint)pbVar11[lVar18 + 2] + 2 >> 2;
                if (pbVar10 == (byte *)0x0) {
                  pbVar10 = (byte *)0x0;
                }
                else {
                  *pbVar10 = bVar2;
                  pbVar10[1] = (byte)uVar19;
                  pbVar10[2] = (byte)uVar4;
                  pbVar10 = pbVar10 + 3;
                }
                if (puVar6 == (uint8_t *)0x0) {
                  puVar6 = (uint8_t *)0x0;
                }
                else {
                  *puVar6 = (uint8_t)(uVar4 * 0xe98 + uVar19 * 0x4b22 + (uint)bVar2 * 0x2646 +
                                      0x4000 >> 0xf);
                  puVar6 = puVar6 + 1;
                }
                uVar19 = (uint)pbVar16[lVar18 + 1] + (uint)pbVar16[lVar18 + 3] + 1 >> 1;
                bVar2 = pbVar16[lVar18 + 2];
                uVar4 = (uint)pbVar11[lVar18 + 2] + (uint)pbVar14[lVar18 + 2] + 1 >> 1;
                if (pbVar10 == (byte *)0x0) {
                  pbVar10 = (byte *)0x0;
                }
                else {
                  *pbVar10 = (byte)uVar19;
                  pbVar10[1] = bVar2;
                  pbVar10[2] = (byte)uVar4;
                  pbVar10 = pbVar10 + 3;
                }
                if (puVar6 == (uint8_t *)0x0) {
                  puVar6 = (uint8_t *)0x0;
                }
                else {
                  *puVar6 = (uint8_t)((uVar4 & 0xff) * 0xe98 +
                                      (uint)bVar2 * 0x4b22 + (uVar19 & 0xff) * 0x2646 + 0x4000 >>
                                     0xf);
                  puVar6 = puVar6 + 1;
                }
                lVar1 = uVar17 + lVar18;
                lVar18 = lVar18 + 2;
              } while (lVar1 + 3U < width);
              uVar17 = uVar17 + lVar18;
              pbVar11 = pbVar11 + lVar18;
              pbVar16 = pbVar16 + lVar18;
              pbVar14 = pbVar14 + lVar18;
            }
            if (uVar17 < width) {
              bVar2 = pbVar16[1];
              uVar15 = (uint)pbVar16[2] + (uint)*pbVar16 + (uint)pbVar11[1] + (uint)pbVar14[1] + 2
                       >> 2;
              uVar19 = (uint)pbVar11[2] + (uint)*pbVar11 + (uint)pbVar14[2] + (uint)*pbVar14 + 2 >>
                       2;
              if (pbVar10 != (byte *)0x0) {
                *pbVar10 = bVar2;
                pbVar10[1] = (byte)uVar15;
                pbVar10[2] = (byte)uVar19;
              }
              if (puVar6 != (uint8_t *)0x0) {
                uVar4 = (uint)bVar2;
                iVar13 = uVar15 * 0x4b22;
                iVar9 = uVar19 * 0xe98;
LAB_0012cce1:
                *puVar6 = (uint8_t)(iVar9 + uVar4 * 0x2646 + iVar13 + 0x4000 >> 0xf);
              }
            }
          }
          else {
            if (bVar21) {
              uVar4 = (uint)local_68[1] + (uint)local_78[1] + 1 >> 1;
              bVar2 = local_88[1];
              uVar19 = (uint)*local_88 + (uint)local_88[2] + 1 >> 1;
              if (rgb_out == (byte *)0x0) {
                pbVar10 = (byte *)0x0;
              }
              else {
                *rgb_out = (byte)uVar4;
                rgb_out[1] = bVar2;
                pbVar10 = rgb_out + 3;
                rgb_out[2] = (byte)uVar19;
              }
              uVar17 = 1;
              pbVar11 = local_88 + 1;
              pbVar14 = local_68 + 1;
              pbVar16 = local_78 + 1;
              if (mono_out == (uint8_t *)0x0) {
                puVar6 = (uint8_t *)0x0;
              }
              else {
                *mono_out = (uint8_t)((uint)bVar2 * 0x4b22 + (uVar4 & 0xff) * 0x2646 +
                                      (uVar19 & 0xff) * 0xe98 + 0x4000 >> 0xf);
                puVar6 = mono_out + 1;
              }
            }
            else {
              uVar17 = 0;
              pbVar10 = rgb_out;
              pbVar11 = local_88;
              pbVar14 = local_68;
              pbVar16 = local_78;
            }
            if (uVar17 + 1 < width) {
              lVar18 = 0;
              do {
                uVar4 = (uint)pbVar16[lVar18] + (uint)pbVar14[lVar18 + 2] + (uint)pbVar14[lVar18] +
                        (uint)pbVar16[lVar18 + 2] + 2 >> 2;
                uVar19 = (uint)pbVar11[lVar18] +
                         (uint)pbVar16[lVar18 + 1] + (uint)pbVar14[lVar18 + 1] +
                         (uint)pbVar11[lVar18 + 2] + 2 >> 2;
                bVar2 = pbVar11[lVar18 + 1];
                if (pbVar10 == (byte *)0x0) {
                  pbVar10 = (byte *)0x0;
                }
                else {
                  *pbVar10 = (byte)uVar4;
                  pbVar10[1] = (byte)uVar19;
                  pbVar10[2] = bVar2;
                  pbVar10 = pbVar10 + 3;
                }
                if (puVar6 == (uint8_t *)0x0) {
                  puVar6 = (uint8_t *)0x0;
                }
                else {
                  *puVar6 = (uint8_t)(uVar19 * 0x4b22 + (uint)bVar2 * 0xe98 + uVar4 * 0x2646 +
                                      0x4000 >> 0xf);
                  puVar6 = puVar6 + 1;
                }
                uVar19 = (uint)pbVar14[lVar18 + 2] + (uint)pbVar16[lVar18 + 2] + 1 >> 1;
                bVar2 = pbVar11[lVar18 + 2];
                uVar4 = (uint)pbVar11[lVar18 + 3] + (uint)pbVar11[lVar18 + 1] + 1 >> 1;
                if (pbVar10 == (byte *)0x0) {
                  pbVar10 = (byte *)0x0;
                }
                else {
                  *pbVar10 = (byte)uVar19;
                  pbVar10[1] = bVar2;
                  pbVar10[2] = (byte)uVar4;
                  pbVar10 = pbVar10 + 3;
                }
                if (puVar6 == (uint8_t *)0x0) {
                  puVar6 = (uint8_t *)0x0;
                }
                else {
                  *puVar6 = (uint8_t)((uVar4 & 0xff) * 0xe98 +
                                      (uint)bVar2 * 0x4b22 + (uVar19 & 0xff) * 0x2646 + 0x4000 >>
                                     0xf);
                  puVar6 = puVar6 + 1;
                }
                lVar1 = uVar17 + lVar18;
                lVar18 = lVar18 + 2;
              } while (lVar1 + 3U < width);
              uVar17 = uVar17 + lVar18;
              pbVar16 = pbVar16 + lVar18;
              pbVar11 = pbVar11 + lVar18;
              pbVar14 = pbVar14 + lVar18;
            }
            if (uVar17 < width) {
              uVar4 = (uint)*pbVar16 + (uint)pbVar14[2] + (uint)*pbVar14 + (uint)pbVar16[2] + 2 >> 2
              ;
              uVar19 = (uint)*pbVar11 + (uint)pbVar16[1] + (uint)pbVar14[1] + (uint)pbVar11[2] + 2
                       >> 2;
              bVar2 = pbVar11[1];
              if (pbVar10 != (byte *)0x0) {
                *pbVar10 = (byte)uVar4;
                pbVar10[1] = (byte)uVar19;
                pbVar10[2] = bVar2;
              }
              if (puVar6 != (uint8_t *)0x0) {
                iVar9 = uVar19 * 0x4b22;
                iVar13 = (uint)bVar2 * 0xe98;
                goto LAB_0012cce1;
              }
            }
          }
          if (rgb_out != (byte *)0x0) {
            rgb_out = rgb_out + local_40;
          }
          if (mono_out != (uint8_t *)0x0) {
            mono_out = mono_out + width;
          }
          bVar21 = (bool)(bVar21 ^ 1);
          bVar20 = (bool)(bVar20 ^ 1);
        } while (local_38 != height);
      }
      operator_delete__(pbVar5);
      return true;
    }
    if ((pixelformat != 0x1080001) && (pixelformat != 0x10800c6)) {
      return false;
    }
LAB_0012ce54:
    if (height == 0) {
      return true;
    }
    sVar12 = 0;
    do {
      if (rgb_out != (uint8_t *)0x0 && width != 0) {
        sVar7 = 0;
        do {
          uVar3 = raw[sVar7];
          *rgb_out = uVar3;
          rgb_out[1] = uVar3;
          rgb_out[2] = uVar3;
          rgb_out = rgb_out + 3;
          sVar7 = sVar7 + 1;
        } while (width != sVar7);
      }
      if (mono_out == (uint8_t *)0x0) {
        mono_out = (uint8_t *)0x0;
      }
      else {
        memcpy(mono_out,raw,width);
        mono_out = mono_out + width;
      }
      raw = raw + xpadding + width;
      sVar12 = sVar12 + 1;
    } while (sVar12 != height);
  }
  else {
    if ((long)pixelformat < 0x210003b) {
      if (pixelformat == 0x20c005a) {
        if (height != 0) {
          sVar12 = 0;
          do {
            if (width != 0) {
              uVar17 = 0;
              do {
                if (rgb_out == (uint8_t *)0x0) {
                  rgb_out = (uint8_t *)0x0;
                }
                else {
                  convYCbCr411toQuadRGB(local_4c,raw,(int)uVar17);
                  lVar18 = 0;
                  do {
                    rgb_out[lVar18] = local_4c[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 0xc);
                  rgb_out = rgb_out + 0xc;
                }
                if (mono_out == (uint8_t *)0x0) {
                  mono_out = (uint8_t *)0x0;
                }
                else {
                  uVar8 = uVar17 >> 2;
                  *mono_out = raw[uVar8 * 6];
                  mono_out[1] = raw[uVar8 * 6 + 1];
                  mono_out[2] = raw[uVar8 * 6 + 3];
                  mono_out[3] = raw[uVar8 * 6 + 4];
                  mono_out = mono_out + 4;
                }
                uVar17 = uVar17 + 4;
              } while (uVar17 < width);
            }
            raw = raw + xpadding + (width >> 2) * 6;
            sVar12 = sVar12 + 1;
          } while (sVar12 != height);
          return true;
        }
        return true;
      }
      if (pixelformat != 0x2100032) {
        return false;
      }
    }
    else if (pixelformat != 0x210003b) {
      if (pixelformat != 0x81080001) {
        if (pixelformat != 0x2180014) {
          return false;
        }
        if (height != 0) {
          __n = width * 3;
          pbVar5 = raw + 2;
          sVar12 = 0;
          do {
            if (rgb_out == (uint8_t *)0x0) {
              rgb_out = (uint8_t *)0x0;
            }
            else {
              memcpy(rgb_out,raw,__n);
              rgb_out = rgb_out + __n;
            }
            pbVar10 = pbVar5;
            sVar7 = width;
            if (mono_out != (uint8_t *)0x0 && width != 0) {
              do {
                *mono_out = (uint8_t)((uint)*pbVar10 * 0xe98 +
                                      (uint)pbVar10[-1] * 0x4b22 + (uint)pbVar10[-2] * 0x2646 +
                                      0x4000 >> 0xf);
                mono_out = mono_out + 1;
                sVar7 = sVar7 - 1;
                pbVar10 = pbVar10 + 3;
              } while (sVar7 != 0);
            }
            raw = raw + xpadding + __n;
            sVar12 = sVar12 + 1;
            pbVar5 = pbVar5 + xpadding + __n;
          } while (sVar12 != height);
          return true;
        }
        return true;
      }
      goto LAB_0012ce54;
    }
    if (height == 0) {
      return true;
    }
    sVar12 = 0;
    do {
      if (width != 0) {
        uVar17 = 0;
        do {
          if (rgb_out == (uint8_t *)0x0) {
            rgb_out = (uint8_t *)0x0;
          }
          else {
            convYCbCr422toQuadRGB(local_4c,raw,(int)uVar17);
            lVar18 = 0;
            do {
              rgb_out[lVar18] = local_4c[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0xc);
            rgb_out = rgb_out + 0xc;
          }
          if (mono_out == (uint8_t *)0x0) {
            mono_out = (uint8_t *)0x0;
          }
          else {
            *mono_out = raw[uVar17 * 2];
            mono_out[1] = raw[uVar17 * 2 + 2];
            mono_out[2] = raw[uVar17 * 2 + 4];
            mono_out[3] = raw[uVar17 * 2 + 6];
            mono_out = mono_out + 4;
          }
          uVar17 = uVar17 + 4;
        } while (uVar17 < width);
      }
      raw = raw + xpadding + (width & 0xfffffffffffffffc) * 2;
      sVar12 = sVar12 + 1;
    } while (sVar12 != height);
  }
  return true;
}

Assistant:

bool convertImage(uint8_t *rgb_out, uint8_t *mono_out, const uint8_t *raw, uint64_t pixelformat,
  size_t width, size_t height, size_t xpadding)
{
  bool ret=true;

  switch (pixelformat)
  {
    case Mono8:
    case Confidence8:
    case Error8:
      {
        for (size_t k=0; k<height; k++)
        {
          if (rgb_out)
          {
            for (size_t i=0; i<width; i++)
            {
              uint8_t v=raw[i];
              *rgb_out++ = v;
              *rgb_out++ = v;
              *rgb_out++ = v;
            }
          }

          if (mono_out)
          {
            std::memcpy(mono_out, raw, width*sizeof(uint8_t));
            mono_out+=width;
          }

          raw+=width+xpadding;
        }
      }
      break;

    case YCbCr411_8:
      {
        size_t pstep=(width>>2)*6+xpadding;
        for (size_t k=0; k<height; k++)
        {
          for (size_t i=0; i<width; i+=4)
          {
            if (rgb_out)
            {
              uint8_t rgb[12];
              convYCbCr411toQuadRGB(rgb, raw, static_cast<int>(i));

              for (int j=0; j<12; j++)
              {
                *rgb_out++ = rgb[j];
              }
            }

            if (mono_out)
            {
              size_t j=(i>>2)*6;
              *mono_out++ = raw[j];
              *mono_out++ = raw[j+1];
              *mono_out++ = raw[j+3];
              *mono_out++ = raw[j+4];
            }
          }

          raw+=pstep;
        }
      }
      break;

    case YCbCr422_8:
    case YUV422_8:
      {
        size_t pstep=(width>>2)*8+xpadding;
        for (size_t k=0; k<height; k++)
        {
          for (size_t i=0; i<width; i+=4)
          {
            if (rgb_out)
            {
              uint8_t rgb[12];
              convYCbCr422toQuadRGB(rgb, raw, static_cast<int>(i));

              for (int j=0; j<12; j++)
              {
                *rgb_out++ = rgb[j];
              }
            }

            if (mono_out)
            {
              size_t j=(i>>2)*8;
              *mono_out++ = raw[j];
              *mono_out++ = raw[j+2];
              *mono_out++ = raw[j+4];
              *mono_out++ = raw[j+6];
            }
          }

          raw+=pstep;
        }
      }
      break;

    case RGB8:
      {
        for (size_t k=0; k<height; k++)
        {
          if (rgb_out)
          {
            std::memcpy(rgb_out, raw, 3*width*sizeof(uint8_t));
            rgb_out+=3*width;
          }

          if (mono_out)
          {
            size_t j=0;
            for (size_t i=0; i<width; i++)
            {
              *mono_out++ = rgb2Grey(raw[j], raw[j+1], raw[j+2]);
              j+=3;
            }
          }

          raw+=3*width+xpadding;
        }
      }
      break;

    case BayerRG8:
    case BayerBG8:
    case BayerGR8:
    case BayerGB8:
      {
        // In every row, every second pixel is green and every other pixel is
        // either red or blue. This flag specifies if the current row is red or
        // blue.

        bool greenfirst=(pixelformat == BayerGR8 || pixelformat == BayerGB8);
        bool red=(pixelformat == BayerRG8 || pixelformat == BayerGR8);

        // setup temporary buffer that is 1 pixel larger than the image

        std::unique_ptr<uint8_t []> buffer(new uint8_t [(width+2)*3]);
        uint8_t *row[3];

        row[0]=buffer.get();
        row[1]=row[0]+width+2;
        row[2]=row[1]+width+2;

        // initialize buffer with 2 rows, extended by two pixel to avoid a special
        // treatment for the image border

        memcpy(row[1]+1, raw+width+xpadding, width*sizeof(uint8_t));
        memcpy(row[2]+1, raw, width*sizeof(uint8_t));

        row[1][0]=row[1][2]; row[1][width+1]=row[1][width-1];
        row[2][0]=row[2][2]; row[2][width+1]=row[2][width-1];

        // for all rows

        for (size_t k=0; k<height; k++)
        {
          // store next extended row in buffer

          if (k+1 < height)
          {
            uint8_t *p=row[0];
            row[0]=row[1];
            row[1]=row[2];
            row[2]=p;

            memcpy(row[2]+1, raw+(k+1)*(width+xpadding), width*sizeof(uint8_t));

            row[2][0]=row[2][2]; row[2][width+1]=row[2][width-1];
          }

          if (red)
          {
            convertBayerGR(rgb_out, mono_out, row[0], row[1], row[2], greenfirst, width);

            if (rgb_out) rgb_out+=3*width;
            if (mono_out) mono_out+=width;
          }
          else
          {
            convertBayerGB(rgb_out, mono_out, row[0], row[1], row[2], greenfirst, width);

            if (rgb_out) rgb_out+=3*width;
            if (mono_out) mono_out+=width;
          }

          greenfirst=!greenfirst;
          red=!red;
        }
      }
      break;

    default:
      ret=false;
      break;
  }

  return ret;
}